

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeUpper(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int i,
             number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *newUpper,bool scale)

{
  uint *puVar1;
  pointer pnVar2;
  type_conflict5 tVar3;
  double *pdVar4;
  undefined7 in_register_00000009;
  cpp_dec_float<100U,_int,_void> local_c8;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  int local_38;
  undefined1 local_34;
  undefined8 local_30;
  
  if ((int)CONCAT71(in_register_00000009,scale) != 0) {
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (&local_c8,*pdVar4,(type *)0x0);
    tVar3 = boost::multiprecision::operator<
                      (newUpper,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_c8);
    if (tVar3) {
      local_78 = (newUpper->m_backend).data._M_elems[0];
      uStack_74 = (newUpper->m_backend).data._M_elems[1];
      uStack_70 = (newUpper->m_backend).data._M_elems[2];
      uStack_6c = (newUpper->m_backend).data._M_elems[3];
      local_68 = (newUpper->m_backend).data._M_elems[4];
      uStack_64 = (newUpper->m_backend).data._M_elems[5];
      uStack_60 = (newUpper->m_backend).data._M_elems[6];
      uStack_5c = (newUpper->m_backend).data._M_elems[7];
      local_58 = (newUpper->m_backend).data._M_elems[8];
      uStack_54 = (newUpper->m_backend).data._M_elems[9];
      uStack_50 = (newUpper->m_backend).data._M_elems[10];
      uStack_4c = (newUpper->m_backend).data._M_elems[0xb];
      local_48 = (newUpper->m_backend).data._M_elems[0xc];
      uStack_44 = (newUpper->m_backend).data._M_elems[0xd];
      uStack_40 = (newUpper->m_backend).data._M_elems[0xe];
      uStack_3c = (newUpper->m_backend).data._M_elems[0xf];
      local_38 = (newUpper->m_backend).exp;
      local_34 = (newUpper->m_backend).neg;
      local_30._0_4_ = (newUpper->m_backend).fpclass;
      local_30._4_4_ = (newUpper->m_backend).prec_elem;
      (*this->lp_scaler->_vptr_SPxScaler[0x2c])(&local_c8,this->lp_scaler,this,i);
      pnVar2 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = pnVar2[i].m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar1 = local_c8.data._M_elems._48_8_;
      *(undefined8 *)(puVar1 + 2) = local_c8.data._M_elems._56_8_;
      puVar1 = pnVar2[i].m_backend.data._M_elems + 8;
      *(undefined8 *)puVar1 = local_c8.data._M_elems._32_8_;
      *(undefined8 *)(puVar1 + 2) = local_c8.data._M_elems._40_8_;
      puVar1 = pnVar2[i].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = local_c8.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = local_c8.data._M_elems._24_8_;
      *(undefined8 *)&pnVar2[i].m_backend.data = local_c8.data._M_elems._0_8_;
      *(undefined8 *)(pnVar2[i].m_backend.data._M_elems + 2) = local_c8.data._M_elems._8_8_;
      pnVar2[i].m_backend.exp = local_c8.exp;
      pnVar2[i].m_backend.neg = local_c8.neg;
      pnVar2[i].m_backend.fpclass = local_c8.fpclass;
      pnVar2[i].m_backend.prec_elem = local_c8.prec_elem;
      return;
    }
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (&(this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).up.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&newUpper->m_backend);
  return;
}

Assistant:

virtual void changeUpper(int i, const R& newUpper, bool scale = false)
   {
      if(scale && newUpper < R(infinity))
      {
         assert(_isScaled);
         assert(lp_scaler);
         LPColSetBase<R>::upper_w(i) = lp_scaler->scaleUpper(*this, i, newUpper);
      }
      else
         LPColSetBase<R>::upper_w(i) = newUpper;

      assert(isConsistent());
   }